

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

void __thiscall
flatbuffers::ToStringVisitor::Field
          (ToStringVisitor *this,size_t param_1,size_t set_idx,ElementaryType param_3,bool param_4,
          TypeTable *param_5,char *name,uint8_t *val)

{
  string *psVar1;
  
  if (val != (uint8_t *)0x0) {
    if (set_idx != 0) {
      std::__cxx11::string::append((char *)&this->s);
      std::__cxx11::string::append((string *)&this->s);
    }
    append_indent(this);
    if (name != (char *)0x0) {
      if (this->q == true) {
        std::__cxx11::string::append((char *)&this->s);
      }
      psVar1 = &this->s;
      std::__cxx11::string::append((char *)psVar1);
      if (this->q == true) {
        std::__cxx11::string::append((char *)psVar1);
      }
      std::__cxx11::string::append((char *)psVar1);
      return;
    }
  }
  return;
}

Assistant:

void Field(size_t /*field_idx*/, size_t set_idx, ElementaryType /*type*/,
             bool /*is_vector*/, const TypeTable * /*type_table*/,
             const char *name, const uint8_t *val) {
    if (!val) return;
    if (set_idx) {
      s += ",";
      s += d;
    }
    append_indent();
    if (name) {
      if (q) s += "\"";
      s += name;
      if (q) s += "\"";
      s += ": ";
    }
  }